

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perspective.h
# Opt level: O2

void __thiscall
phyr::PerspectiveCamera::PerspectiveCamera
          (PerspectiveCamera *this,Transform *cameraToWorld,Bounds2f *screenBounds,double lensRadius
          ,double focalDistance,double fov,Film *film)

{
  Transform *this_00;
  undefined1 auVar1 [16];
  double dVar2;
  double dVar3;
  double dStack_180;
  Point3<double> local_168;
  Point3<double> local_148;
  Transform local_128;
  
  Transform::perspective(&local_128,fov,0.009999999776482582,1000.0);
  ProjectiveCamera::ProjectiveCamera
            (&this->super_ProjectiveCamera,cameraToWorld,&local_128,screenBounds,lensRadius,
             focalDistance,film);
  (this->super_ProjectiveCamera).super_Camera._vptr_Camera = (_func_int **)&PTR__Camera_00197fd8;
  this_00 = &(this->super_ProjectiveCamera).rasterToCamera;
  local_168.z = 0.0;
  local_168.x = 0.0;
  local_168.y = 0.0;
  dVar2 = (double)(film->resolution).x;
  dVar3 = (double)(film->resolution).y;
  auVar1._8_4_ = SUB84(dVar3,0);
  auVar1._0_8_ = dVar2;
  auVar1._12_4_ = (int)((ulong)dVar3 >> 0x20);
  Transform::operator()(this_00,&local_168);
  dStack_180 = auVar1._8_8_;
  local_148.y = dStack_180;
  local_148.z = 0.0;
  local_148.x = dVar2;
  Transform::operator()(this_00,&local_148);
  this->imagePlaneArea =
       ABS(((1.0 / local_168.z) * local_168.y -
           (1.0 / local_128.mat.d[0][2]) * local_128.mat.d[0][1]) *
           (local_168.x * (1.0 / local_168.z) -
           local_128.mat.d[0][0] * (1.0 / local_128.mat.d[0][2])));
  return;
}

Assistant:

PerspectiveCamera(const Transform& cameraToWorld, const Bounds2f& screenBounds,
                      Real lensRadius, Real focalDistance, Real fov, Film* film) :
        ProjectiveCamera(cameraToWorld, Transform::perspective(fov, 1e-2f, 1000.0f),
                         screenBounds, lensRadius, focalDistance, film) {
        // Compute image plane bounds
        Point2i res = film->resolution;
        Point3f pMin = rasterToCamera(Point3f(0, 0, 0));
        Point3f pMax = rasterToCamera(Point3f(res.x, res.y, 0));

        // Z - divide
        pMin /= pMin.z; pMax /= pMax.z;
        imagePlaneArea = std::abs((pMax.x - pMin.x) * (pMax.y - pMin.y));
    }